

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset.cpp
# Opt level: O3

UBool uset_serializedContains_63(USerializedSet *set,UChar32 c)

{
  int iVar1;
  int iVar2;
  ushort *puVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  if ((uint)c < 0x110000 && set != (USerializedSet *)0x0) {
    puVar3 = set->array;
    if ((uint)c < 0x10000) {
      uVar5 = 0;
      if (((uint)*puVar3 <= (uint)c) &&
         (uVar5 = (ulong)set->bmpLength, (uint)c < (uint)puVar3[uVar5 - 1])) {
        uVar5 = uVar5 - 1;
        if (1 < (uint)uVar5) {
          uVar6 = (int)(uint)uVar5 >> 1;
          uVar4 = 0;
          do {
            uVar7 = uVar6;
            if (c < (int)(uint)puVar3[(int)uVar6]) {
              uVar5 = (ulong)uVar6;
              uVar7 = uVar4;
            }
            uVar6 = (int)(uVar7 + (int)uVar5) >> 1;
            uVar4 = uVar7;
          } while (uVar6 != uVar7);
        }
      }
    }
    else {
      uVar8 = (uint)c >> 0x10;
      iVar1 = set->bmpLength;
      iVar2 = set->length;
      uVar7 = iVar2 - iVar1;
      uVar6 = uVar7 - 2;
      uVar4 = 0;
      if ((((puVar3[iVar1] <= uVar8) &&
           ((uVar8 != puVar3[iVar1] || ((uint)puVar3[(long)iVar1 + 1] <= (c & 0xffffU))))) &&
          ((uVar8 < puVar3[(long)iVar2 + -2] ||
           ((uVar4 = uVar7, uVar8 == puVar3[(long)iVar2 + -2] &&
            ((c & 0xffffU) < (uint)puVar3[(long)iVar2 + -1])))))) &&
         (uVar7 = (int)uVar6 >> 1 & 0xfffffffe, uVar4 = uVar6, uVar7 != 0)) {
        uVar9 = 0;
        do {
          uVar4 = uVar7;
          if ((puVar3[(int)(uVar7 + iVar1)] <= uVar8) &&
             ((uVar8 != puVar3[(int)(uVar7 + iVar1)] ||
              ((uint)puVar3[(long)(int)(uVar7 + iVar1) + 1] <= (c & 0xffffU))))) {
            uVar4 = uVar6;
            uVar9 = uVar7;
          }
          uVar6 = uVar4;
          uVar7 = (int)(uVar6 + uVar9) >> 1 & 0xfffffffe;
          uVar4 = uVar6;
        } while (uVar7 != uVar9);
      }
      uVar5 = (ulong)((uVar4 >> 1) + iVar1);
    }
    return (byte)uVar5 & 1;
  }
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2
uset_serializedContains(const USerializedSet* set, UChar32 c) {
    const uint16_t* array;

    if(set==NULL || (uint32_t)c>0x10ffff) {
        return FALSE;
    }

    array=set->array;
    if(c<=0xffff) {
        /* find c in the BMP part */
        int32_t lo = 0;
        int32_t hi = set->bmpLength-1;
        if (c < array[0]) {
            hi = 0;
        } else if (c < array[hi]) {
            for(;;) {
                int32_t i = (lo + hi) >> 1;
                if (i == lo) {
                    break;  // Done!
                } else if (c < array[i]) {
                    hi = i;
                } else {
                    lo = i;
                }
            }
        } else {
            hi += 1;
        }
        return (UBool)(hi&1);
    } else {
        /* find c in the supplementary part */
        uint16_t high=(uint16_t)(c>>16), low=(uint16_t)c;
        int32_t base = set->bmpLength;
        int32_t lo = 0;
        int32_t hi = set->length - 2 - base;
        if (high < array[base] || (high==array[base] && low<array[base+1])) {
            hi = 0;
        } else if (high < array[base+hi] || (high==array[base+hi] && low<array[base+hi+1])) {
            for (;;) {
                int32_t i = ((lo + hi) >> 1) & ~1;  // Guarantee even result
                int32_t iabs = i + base;
                if (i == lo) {
                    break;  // Done!
                } else if (high < array[iabs] || (high==array[iabs] && low<array[iabs+1])) {
                    hi = i;
                } else {
                    lo = i;
                }
            }
        } else {
            hi += 2;
        }
        /* count pairs of 16-bit units even per BMP and check if the number of pairs is odd */
        return (UBool)(((hi+(base<<1))&2)!=0);
    }
}